

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O2

void __thiscall llvm::printHTMLEscaped(llvm *this,StringRef String,raw_ostream *Out)

{
  llvm C;
  char *pcVar1;
  char *Str;
  
  pcVar1 = (char *)0x0;
  do {
    if (String.Data == pcVar1) {
      return;
    }
    C = this[(long)pcVar1];
    if (C == (llvm)0x22) {
      Str = "&quot;";
LAB_00152530:
      raw_ostream::operator<<((raw_ostream *)String.Length,Str);
    }
    else {
      if (C == (llvm)0x3e) {
        Str = "&gt;";
        goto LAB_00152530;
      }
      if (C == (llvm)0x27) {
        Str = "&apos;";
        goto LAB_00152530;
      }
      if (C == (llvm)0x3c) {
        Str = "&lt;";
        goto LAB_00152530;
      }
      if (C == (llvm)0x26) {
        Str = "&amp;";
        goto LAB_00152530;
      }
      raw_ostream::operator<<((raw_ostream *)String.Length,(char)C);
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

void llvm::printHTMLEscaped(StringRef String, raw_ostream &Out) {
  for (char C : String) {
    if (C == '&')
      Out << "&amp;";
    else if (C == '<')
      Out << "&lt;";
    else if (C == '>')
      Out << "&gt;";
    else if (C == '\"')
      Out << "&quot;";
    else if (C == '\'')
      Out << "&apos;";
    else
      Out << C;
  }
}